

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CLI11.hpp
# Opt level: O3

Option * __thiscall
CLI::App::add_option
          (App *this,string *option_name,callback_t *option_callback,string *option_description,
          bool defaulted,
          function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>
          *func)

{
  pointer pcVar1;
  App *pAVar2;
  pointer pcVar3;
  iterator __position;
  __normal_iterator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_*,_std::vector<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>,_std::allocator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_>_>_>
  _Var4;
  Option *pOVar5;
  OptionAlreadyAdded *pOVar6;
  string *__rhs;
  pointer pbVar7;
  unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_> *puVar8;
  unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_> *puVar9;
  __uniq_ptr_impl<CLI::Option,_std::default_delete<CLI::Option>_> *this_00;
  string test_name;
  Option myopt;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_488;
  vector<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>,_std::allocator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_>_>
  *local_468;
  callback_t *local_460;
  function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>
  *local_458;
  string *local_450;
  string *local_448;
  string local_440;
  string local_420;
  string local_400;
  string local_3e0;
  _Any_data local_3c0;
  code *local_3b0;
  _Any_data local_3a0;
  code *local_390;
  string local_380;
  string local_360;
  string local_340;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_320;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_300;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2c0;
  string local_2a0;
  Option local_280;
  
  pcVar1 = (option_name->_M_dataplus)._M_p;
  local_458 = func;
  local_448 = option_name;
  local_3e0._M_dataplus._M_p = (pointer)&local_3e0.field_2;
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)&local_3e0,pcVar1,pcVar1 + option_name->_M_string_length);
  pcVar1 = (option_description->_M_dataplus)._M_p;
  local_450 = option_description;
  local_400._M_dataplus._M_p = (pointer)&local_400.field_2;
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)&local_400,pcVar1,pcVar1 + option_description->_M_string_length);
  std::
  function<bool_(const_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&)>
  ::function((function<bool_(const_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&)>
              *)&local_3a0,option_callback);
  Option::Option(&local_280,&local_3e0,&local_400,(callback_t *)&local_3a0,this);
  if (local_390 != (code *)0x0) {
    (*local_390)(&local_3a0,&local_3a0,__destroy_functor);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_400._M_dataplus._M_p != &local_400.field_2) {
    operator_delete(local_400._M_dataplus._M_p,local_400.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3e0._M_dataplus._M_p != &local_3e0.field_2) {
    operator_delete(local_3e0._M_dataplus._M_p,local_3e0.field_2._M_allocated_capacity + 1);
  }
  _Var4 = ::std::
          __find_if<__gnu_cxx::__normal_iterator<std::unique_ptr<CLI::Option,std::default_delete<CLI::Option>>*,std::vector<std::unique_ptr<CLI::Option,std::default_delete<CLI::Option>>,std::allocator<std::unique_ptr<CLI::Option,std::default_delete<CLI::Option>>>>>,__gnu_cxx::__ops::_Iter_pred<CLI::App::add_option(std::__cxx11::string,std::function<bool(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&)>,std::__cxx11::string,bool,std::function<std::__cxx11::string()>)::_lambda(std::unique_ptr<CLI::Option,std::default_delete<CLI::Option>>const&)_1_>>
                    ((this->options_).
                     super__Vector_base<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>,_std::allocator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start,
                     (this->options_).
                     super__Vector_base<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>,_std::allocator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish,&local_280);
  local_468 = &this->options_;
  puVar9 = (this->options_).
           super__Vector_base<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>,_std::allocator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (_Var4._M_current != puVar9) {
    puVar8 = (local_468->
             super__Vector_base<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>,_std::allocator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    if (puVar8 != puVar9) {
      do {
        __rhs = Option::matching_name_abi_cxx11_
                          ((puVar8->_M_t).
                           super___uniq_ptr_impl<CLI::Option,_std::default_delete<CLI::Option>_>.
                           _M_t.
                           super__Tuple_impl<0UL,_CLI::Option_*,_std::default_delete<CLI::Option>_>.
                           super__Head_base<0UL,_CLI::Option_*,_false>._M_head_impl,&local_280);
        if (__rhs->_M_string_length != 0) {
          pOVar6 = (OptionAlreadyAdded *)__cxa_allocate_exception(0x38);
          ::std::operator+(&local_320,"added option matched existing option name: ",
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           __rhs);
          CLI::OptionAlreadyAdded::OptionAlreadyAdded(pOVar6,(string *)&local_320);
          __cxa_throw(pOVar6,&CLI::OptionAlreadyAdded::typeinfo,Error::~Error);
        }
        puVar8 = puVar8 + 1;
      } while (puVar8 != puVar9);
    }
    pOVar6 = (OptionAlreadyAdded *)__cxa_allocate_exception(0x38);
    local_380._M_dataplus._M_p = (pointer)&local_380.field_2;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_380,"added option matched existing option name","");
    CLI::OptionAlreadyAdded::OptionAlreadyAdded(pOVar6,&local_380);
    __cxa_throw(pOVar6,&CLI::OptionAlreadyAdded::typeinfo,Error::~Error);
  }
  local_460 = option_callback;
  if (local_280.lnames_.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start ==
      local_280.lnames_.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    if (local_280.snames_.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start ==
        local_280.snames_.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      ::std::operator+(&local_488,"--",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       (&local_280.pname_ + (local_280.pname_._M_string_length == 0)));
      if (local_488._M_string_length == 3) {
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::erase
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_488,0
                   ,1);
      }
      local_2a0._M_dataplus._M_p = (pointer)&local_2a0.field_2;
      ::std::__cxx11::string::_M_construct<char*>
                ((string *)&local_2a0,local_488._M_dataplus._M_p,
                 local_488._M_dataplus._M_p + local_488._M_string_length);
      pOVar5 = get_option_no_throw(this,&local_2a0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2a0._M_dataplus._M_p != &local_2a0.field_2) {
        operator_delete(local_2a0._M_dataplus._M_p,local_2a0.field_2._M_allocated_capacity + 1);
      }
      if ((pOVar5 != (Option *)0x0) &&
         ((pOVar5->super_OptionBase<CLI::Option>).configurable_ == true)) {
        pOVar6 = (OptionAlreadyAdded *)__cxa_allocate_exception(0x38);
        ::std::operator+(&local_2c0,"added option positional name matches existing option: ",
                         &local_488);
        CLI::OptionAlreadyAdded::OptionAlreadyAdded(pOVar6,(string *)&local_2c0);
        __cxa_throw(pOVar6,&CLI::OptionAlreadyAdded::typeinfo,Error::~Error);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_488._M_dataplus._M_p != &local_488.field_2) {
        operator_delete(local_488._M_dataplus._M_p,local_488.field_2._M_allocated_capacity + 1);
      }
      goto LAB_0024945b;
    }
    if (this->parent_ == (App *)0x0) goto LAB_0024945b;
  }
  else {
    if (this->parent_ == (App *)0x0) goto LAB_0024945b;
    pbVar7 = local_280.lnames_.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    do {
      pAVar2 = this->parent_;
      pcVar3 = (pbVar7->_M_dataplus)._M_p;
      local_340._M_dataplus._M_p = (pointer)&local_340.field_2;
      ::std::__cxx11::string::_M_construct<char*>
                ((string *)&local_340,pcVar3,pcVar3 + pbVar7->_M_string_length);
      pOVar5 = get_option_no_throw(pAVar2,&local_340);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_340._M_dataplus._M_p != &local_340.field_2) {
        operator_delete(local_340._M_dataplus._M_p,local_340.field_2._M_allocated_capacity + 1);
      }
      if ((pOVar5 != (Option *)0x0) &&
         ((pOVar5->super_OptionBase<CLI::Option>).configurable_ == true)) {
        pOVar6 = (OptionAlreadyAdded *)__cxa_allocate_exception(0x38);
        ::std::operator+(&local_2e0,"added option matches existing positional option: ",pbVar7);
        CLI::OptionAlreadyAdded::OptionAlreadyAdded(pOVar6,(string *)&local_2e0);
        __cxa_throw(pOVar6,&CLI::OptionAlreadyAdded::typeinfo,Error::~Error);
      }
      pbVar7 = pbVar7 + 1;
    } while (pbVar7 != local_280.lnames_.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish);
  }
  if (local_280.snames_.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      local_280.snames_.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    pbVar7 = local_280.snames_.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    do {
      pAVar2 = this->parent_;
      pcVar3 = (pbVar7->_M_dataplus)._M_p;
      local_360._M_dataplus._M_p = (pointer)&local_360.field_2;
      ::std::__cxx11::string::_M_construct<char*>
                ((string *)&local_360,pcVar3,pcVar3 + pbVar7->_M_string_length);
      pOVar5 = get_option_no_throw(pAVar2,&local_360);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_360._M_dataplus._M_p != &local_360.field_2) {
        operator_delete(local_360._M_dataplus._M_p,local_360.field_2._M_allocated_capacity + 1);
      }
      if ((pOVar5 != (Option *)0x0) &&
         ((pOVar5->super_OptionBase<CLI::Option>).configurable_ == true)) {
        pOVar6 = (OptionAlreadyAdded *)__cxa_allocate_exception(0x38);
        ::std::operator+(&local_300,"added option matches existing positional option: ",pbVar7);
        CLI::OptionAlreadyAdded::OptionAlreadyAdded(pOVar6,(string *)&local_300);
        __cxa_throw(pOVar6,&CLI::OptionAlreadyAdded::typeinfo,Error::~Error);
      }
      pbVar7 = pbVar7 + 1;
    } while (pbVar7 != local_280.snames_.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish);
  }
LAB_0024945b:
  __position._M_current =
       (this->options_).
       super__Vector_base<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>,_std::allocator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  if (__position._M_current ==
      (this->options_).
      super__Vector_base<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>,_std::allocator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::
    vector<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>,_std::allocator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_>_>
    ::_M_realloc_insert<>(local_468,__position);
    puVar9 = (this->options_).
             super__Vector_base<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>,_std::allocator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
  }
  else {
    ((__position._M_current)->_M_t).
    super___uniq_ptr_impl<CLI::Option,_std::default_delete<CLI::Option>_>._M_t.
    super__Tuple_impl<0UL,_CLI::Option_*,_std::default_delete<CLI::Option>_>.
    super__Head_base<0UL,_CLI::Option_*,_false>._M_head_impl = (Option *)0x0;
    puVar9 = __position._M_current + 1;
    (this->options_).
    super__Vector_base<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>,_std::allocator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = puVar9;
  }
  pOVar5 = (Option *)operator_new(0x250);
  pcVar1 = (local_448->_M_dataplus)._M_p;
  local_420._M_dataplus._M_p = (pointer)&local_420.field_2;
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)&local_420,pcVar1,pcVar1 + local_448->_M_string_length);
  pcVar1 = (local_450->_M_dataplus)._M_p;
  local_440._M_dataplus._M_p = (pointer)&local_440.field_2;
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)&local_440,pcVar1,pcVar1 + local_450->_M_string_length);
  std::
  function<bool_(const_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&)>
  ::function((function<bool_(const_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&)>
              *)&local_3c0,local_460);
  Option::Option(pOVar5,&local_420,&local_440,(callback_t *)&local_3c0,this);
  this_00 = (__uniq_ptr_impl<CLI::Option,_std::default_delete<CLI::Option>_> *)(puVar9 + -1);
  std::__uniq_ptr_impl<CLI::Option,_std::default_delete<CLI::Option>_>::reset(this_00,pOVar5);
  if (local_3b0 != (code *)0x0) {
    (*local_3b0)(&local_3c0,&local_3c0,__destroy_functor);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_440._M_dataplus._M_p != &local_440.field_2) {
    operator_delete(local_440._M_dataplus._M_p,local_440.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_420._M_dataplus._M_p != &local_420.field_2) {
    operator_delete(local_420._M_dataplus._M_p,local_420.field_2._M_allocated_capacity + 1);
  }
  std::function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>
  ::operator=(&((this_00->_M_t).
                super__Tuple_impl<0UL,_CLI::Option_*,_std::default_delete<CLI::Option>_>.
                super__Head_base<0UL,_CLI::Option_*,_false>._M_head_impl)->default_function_,
              local_458);
  if (defaulted) {
    Option::capture_default_str
              ((this_00->_M_t).
               super__Tuple_impl<0UL,_CLI::Option_*,_std::default_delete<CLI::Option>_>.
               super__Head_base<0UL,_CLI::Option_*,_false>._M_head_impl);
  }
  OptionBase<CLI::OptionDefaults>::copy_to<CLI::Option>
            (&(this->option_defaults_).super_OptionBase<CLI::OptionDefaults>,
             (this_00->_M_t).
             super__Tuple_impl<0UL,_CLI::Option_*,_std::default_delete<CLI::Option>_>.
             super__Head_base<0UL,_CLI::Option_*,_false>._M_head_impl);
  pOVar5 = (this_00->_M_t).super__Tuple_impl<0UL,_CLI::Option_*,_std::default_delete<CLI::Option>_>.
           super__Head_base<0UL,_CLI::Option_*,_false>._M_head_impl;
  if ((!defaulted) && ((pOVar5->super_OptionBase<CLI::Option>).always_capture_default_ == true)) {
    Option::capture_default_str(pOVar5);
    pOVar5 = (this_00->_M_t).
             super__Tuple_impl<0UL,_CLI::Option_*,_std::default_delete<CLI::Option>_>.
             super__Head_base<0UL,_CLI::Option_*,_false>._M_head_impl;
  }
  Option::~Option(&local_280);
  return pOVar5;
}

Assistant:

CLI11_INLINE Option *App::add_option(std::string option_name,
                                     callback_t option_callback,
                                     std::string option_description,
                                     bool defaulted,
                                     std::function<std::string()> func) {
    Option myopt{option_name, option_description, option_callback, this};

    if(std::find_if(std::begin(options_), std::end(options_), [&myopt](const Option_p &v) { return *v == myopt; }) ==
       std::end(options_)) {
        if(myopt.lnames_.empty() && myopt.snames_.empty()) {
            // if the option is positional only there is additional potential for ambiguities in config files and needs
            // to be checked
            std::string test_name = "--" + myopt.get_single_name();
            if(test_name.size() == 3) {
                test_name.erase(0, 1);
            }

            auto *op = get_option_no_throw(test_name);
            if(op != nullptr && op->get_configurable()) {
                throw(OptionAlreadyAdded("added option positional name matches existing option: " + test_name));
            }
        } else if(parent_ != nullptr) {
            for(auto &ln : myopt.lnames_) {
                auto *op = parent_->get_option_no_throw(ln);
                if(op != nullptr && op->get_configurable()) {
                    throw(OptionAlreadyAdded("added option matches existing positional option: " + ln));
                }
            }
            for(auto &sn : myopt.snames_) {
                auto *op = parent_->get_option_no_throw(sn);
                if(op != nullptr && op->get_configurable()) {
                    throw(OptionAlreadyAdded("added option matches existing positional option: " + sn));
                }
            }
        }
        options_.emplace_back();
        Option_p &option = options_.back();
        option.reset(new Option(option_name, option_description, option_callback, this));

        // Set the default string capture function
        option->default_function(func);

        // For compatibility with CLI11 1.7 and before, capture the default string here
        if(defaulted)
            option->capture_default_str();

        // Transfer defaults to the new option
        option_defaults_.copy_to(option.get());

        // Don't bother to capture if we already did
        if(!defaulted && option->get_always_capture_default())
            option->capture_default_str();

        return option.get();
    }
    // we know something matches now find what it is so we can produce more error information
    for(auto &opt : options_) {
        const auto &matchname = opt->matching_name(myopt);
        if(!matchname.empty()) {
            throw(OptionAlreadyAdded("added option matched existing option name: " + matchname));
        }
    }
    // this line should not be reached the above loop should trigger the throw
    throw(OptionAlreadyAdded("added option matched existing option name"));  // LCOV_EXCL_LINE
}